

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

uint32 __thiscall rw::Stream::write16(Stream *this,void *data,uint32 length)

{
  uint32 uVar1;
  
  uVar1 = (*this->_vptr_Stream[3])();
  return uVar1;
}

Assistant:

uint32
Stream::write16(const void *data, uint32 length)
{
#ifdef BIGENDIAN
	uint8 *src = (uint8*)data;
	uint16 buf[256];
	int32 n, len;
	for(len = length >>= 1; len > 0; len -= 256){
		n = len < 256 ? len : 256;
		memcpy(buf, src, n*2);
		memLittle16(buf, n*2);
		write8(buf, n*2);
		src += n*2;
	}
	return length;
#else
	return write8(data, length);
#endif
}